

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O1

void __thiscall
cfd::js::api::json::PsbtBip32Data::PsbtBip32Data(PsbtBip32Data *this,PsbtBip32Data *param_1)

{
  pointer pcVar1;
  
  (this->super_JsonClassBase<cfd::js::api::json::PsbtBip32Data>)._vptr_JsonClassBase =
       (_func_int **)&PTR__PsbtBip32Data_00a8e6f0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&(this->ignore_items)._M_t,&(param_1->ignore_items)._M_t);
  (this->pubkey_)._M_dataplus._M_p = (pointer)&(this->pubkey_).field_2;
  pcVar1 = (param_1->pubkey_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->pubkey_,pcVar1,pcVar1 + (param_1->pubkey_)._M_string_length);
  (this->master_fingerprint_)._M_dataplus._M_p = (pointer)&(this->master_fingerprint_).field_2;
  pcVar1 = (param_1->master_fingerprint_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->master_fingerprint_,pcVar1,
             pcVar1 + (param_1->master_fingerprint_)._M_string_length);
  (this->path_)._M_dataplus._M_p = (pointer)&(this->path_).field_2;
  pcVar1 = (param_1->path_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->path_,pcVar1,pcVar1 + (param_1->path_)._M_string_length);
  (this->descriptor_)._M_dataplus._M_p = (pointer)&(this->descriptor_).field_2;
  pcVar1 = (param_1->descriptor_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->descriptor_,pcVar1,pcVar1 + (param_1->descriptor_)._M_string_length);
  return;
}

Assistant:

PsbtBip32Data() {
    CollectFieldName();
  }